

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::TrivialAtomicInt::set(TrivialAtomicInt *this,int v)

{
  int v_local;
  TrivialAtomicInt *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *(int *)this->int_ = v;
  return;
}

Assistant:

void set(int v) {
      reinterpret_cast<AtomicT*>(int_)->store(v, std::memory_order_relaxed);
    }